

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O1

unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>,_true>
duckdb::ArrowBit::GetType(ArrowSchema *schema,ArrowSchemaMetadata *schema_metadata)

{
  int iVar1;
  ArrowStringInfo *this;
  char *pcVar2;
  InvalidInputException *this_00;
  string format;
  string local_68;
  char *local_48 [2];
  char local_38 [16];
  
  ::std::__cxx11::string::string
            ((string *)local_48,(char *)(schema_metadata->schema_metadata_map)._M_h._M_buckets,
             (allocator *)&local_68);
  iVar1 = ::std::__cxx11::string::compare((char *)local_48);
  if (iVar1 == 0) {
    this = (ArrowStringInfo *)operator_new(0x18);
    ArrowStringInfo::ArrowStringInfo(this,NORMAL);
    pcVar2 = (char *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_68,BIT);
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)local_48);
    if (iVar1 != 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Arrow extension type \"%s\" not supported for BIT type","");
      InvalidInputException::InvalidInputException<char_const*>(this_00,&local_68,local_48[0]);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this = (ArrowStringInfo *)operator_new(0x18);
    ArrowStringInfo::ArrowStringInfo(this,SUPER_SIZE);
    pcVar2 = (char *)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_68,BIT);
  }
  pcVar2[0] = '\0';
  pcVar2[1] = '\0';
  pcVar2[2] = '\0';
  pcVar2[3] = '\0';
  pcVar2[4] = '\0';
  pcVar2[5] = '\0';
  pcVar2[6] = '\0';
  pcVar2[7] = '\0';
  pcVar2[8] = '\0';
  pcVar2[9] = '\0';
  pcVar2[10] = '\0';
  pcVar2[0xb] = '\0';
  pcVar2[0xc] = '\0';
  pcVar2[0xd] = '\0';
  pcVar2[0xe] = '\0';
  pcVar2[0xf] = '\0';
  LogicalType::LogicalType((LogicalType *)(pcVar2 + 0x10),(LogicalType *)&local_68);
  pcVar2[0x30] = '\0';
  pcVar2[0x28] = '\0';
  pcVar2[0x29] = '\0';
  pcVar2[0x2a] = '\0';
  pcVar2[0x2b] = '\0';
  pcVar2[0x2c] = '\0';
  pcVar2[0x2d] = '\0';
  pcVar2[0x2e] = '\0';
  pcVar2[0x2f] = '\0';
  *(ArrowStringInfo **)(pcVar2 + 0x38) = this;
  *(char **)(pcVar2 + 0x40) = pcVar2 + 0x50;
  pcVar2[0x48] = '\0';
  pcVar2[0x49] = '\0';
  pcVar2[0x4a] = '\0';
  pcVar2[0x4b] = '\0';
  pcVar2[0x4c] = '\0';
  pcVar2[0x4d] = '\0';
  pcVar2[0x4e] = '\0';
  pcVar2[0x4f] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x60] = '\0';
  schema->format = pcVar2;
  LogicalType::~LogicalType((LogicalType *)&local_68);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)
         (unique_ptr<duckdb::ArrowType,_std::default_delete<duckdb::ArrowType>_>)schema;
}

Assistant:

static unique_ptr<ArrowType> GetType(const ArrowSchema &schema, const ArrowSchemaMetadata &schema_metadata) {
		const auto format = string(schema.format);
		if (format == "z") {
			return make_uniq<ArrowType>(LogicalType::BIT, make_uniq<ArrowStringInfo>(ArrowVariableSizeType::NORMAL));
		} else if (format == "Z") {
			return make_uniq<ArrowType>(LogicalType::BIT,
			                            make_uniq<ArrowStringInfo>(ArrowVariableSizeType::SUPER_SIZE));
		}
		throw InvalidInputException("Arrow extension type \"%s\" not supported for BIT type", format.c_str());
	}